

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

BigInteger * __thiscall
Rational::operator_cast_to_BigInteger(BigInteger *__return_storage_ptr__,Rational *this)

{
  compare_t cVar1;
  BigInteger local_48;
  
  BigInteger::BigInteger(&local_48,1);
  cVar1 = BigInteger::_compare(&this->_denominator,&local_48);
  if (local_48.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (cVar1 == CMP_EQUAL) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&__return_storage_ptr__->digits,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    __return_storage_ptr__->negative = (this->_numerator).negative;
  }
  else {
    operator/(__return_storage_ptr__,&this->_numerator,&this->_denominator);
  }
  return __return_storage_ptr__;
}

Assistant:

explicit operator const BigInteger() const
    {
        if(_denominator == 1)
            return _numerator;
        return _numerator / _denominator;
    }